

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockAgentTest.cpp
# Opt level: O0

void __thiscall
jaegertracing::testutils::MockAgent_testSamplingManager_Test::TestBody
          (MockAgent_testSamplingManager_Test *this)

{
  bool bVar1;
  ostream *poVar2;
  element_type *peVar3;
  string *psVar4;
  char *pcVar5;
  AssertHelper local_10c8 [8];
  Message local_10c0 [8];
  undefined1 local_10b8 [8];
  AssertionResult gtest_ar_3;
  input_adapter local_1088;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  local_1078;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  local_1068 [7];
  SamplingStrategyResponse local_ff0 [8];
  SamplingStrategyResponse response_3;
  URI local_f78 [8];
  Response responseHTTP_1;
  string local_ef8 [8];
  URI uri_3;
  string local_e70 [8];
  __string_type uriStr_3;
  string local_dc8;
  ostringstream local_da8 [8];
  ostringstream oss_3;
  RateLimitingSamplingStrategy local_c30 [8];
  RateLimitingSamplingStrategy rateLimiting;
  SamplingStrategyResponse local_c20 [8];
  SamplingStrategyResponse config;
  AssertHelper local_ba8 [8];
  Message local_ba0 [12];
  type local_b94;
  undefined1 local_b90 [8];
  AssertionResult gtest_ar_2;
  input_adapter local_b60;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  local_b50;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  local_b40 [7];
  SamplingStrategyResponse local_ac8 [8];
  SamplingStrategyResponse response_2;
  URI local_a50 [8];
  Response responseHTTP;
  string local_9d0 [8];
  URI uri_2;
  string local_948 [8];
  __string_type uriStr_2;
  string local_8a0;
  ostringstream local_880 [8];
  ostringstream oss_2;
  AssertHelper local_708 [8];
  Message local_700 [8];
  undefined1 local_6f8 [8];
  AssertionResult gtest_ar_1;
  Response response_1;
  string local_668 [8];
  URI uri_1;
  string local_5e0 [8];
  __string_type uriStr_1;
  string local_538;
  ostringstream local_518 [8];
  ostringstream oss_1;
  AssertHelper local_398 [8];
  Message local_390 [8];
  undefined1 local_388 [8];
  AssertionResult gtest_ar;
  Response response;
  string local_2f8 [8];
  URI uri;
  string local_270 [8];
  __string_type uriStr;
  string local_1c8;
  ostringstream local_1a8 [8];
  ostringstream oss;
  undefined1 local_20 [8];
  shared_ptr<jaegertracing::testutils::MockAgent> mockAgent;
  MockAgent_testSamplingManager_Test *this_local;
  
  mockAgent.super___shared_ptr<jaegertracing::testutils::MockAgent,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
  MockAgent::make();
  std::
  __shared_ptr_access<jaegertracing::testutils::MockAgent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->((__shared_ptr_access<jaegertracing::testutils::MockAgent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)local_20);
  jaegertracing::testutils::MockAgent::start();
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  poVar2 = std::operator<<((ostream *)local_1a8,"http://");
  peVar3 = std::
           __shared_ptr_access<jaegertracing::testutils::MockAgent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<jaegertracing::testutils::MockAgent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_20);
  MockAgent::samplingServerAddress((IPAddress *)((long)&uriStr.field_2 + 8),peVar3);
  net::IPAddress::authority_abi_cxx11_(&local_1c8,(IPAddress *)((long)&uriStr.field_2 + 8));
  poVar2 = std::operator<<(poVar2,(string *)&local_1c8);
  std::operator<<(poVar2,'/');
  std::__cxx11::string::~string((string *)&local_1c8);
  std::__cxx11::ostringstream::str();
  jaegertracing::net::URI::parse(local_2f8);
  jaegertracing::net::http::get((URI *)&gtest_ar.message_);
  psVar4 = net::http::Response::body_abi_cxx11_((Response *)&gtest_ar.message_);
  testing::internal::EqHelper<false>::Compare<char[23],std::__cxx11::string>
            ((EqHelper<false> *)local_388,"\"no \'service\' parameter\"","response.body()",
             (char (*) [23])"no \'service\' parameter",psVar4);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_388);
  if (!bVar1) {
    testing::Message::Message(local_390);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_388);
    testing::internal::AssertHelper::AssertHelper
              (local_398,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/testutils/MockAgentTest.cpp"
               ,0x53,pcVar5);
    testing::internal::AssertHelper::operator=(local_398,local_390);
    testing::internal::AssertHelper::~AssertHelper(local_398);
    testing::Message::~Message(local_390);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_388);
  net::http::Response::~Response((Response *)&gtest_ar.message_);
  net::URI::~URI((URI *)local_2f8);
  std::__cxx11::string::~string(local_270);
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  if (bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_518);
    poVar2 = std::operator<<((ostream *)local_518,"http://");
    peVar3 = std::
             __shared_ptr_access<jaegertracing::testutils::MockAgent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<jaegertracing::testutils::MockAgent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_20);
    MockAgent::samplingServerAddress((IPAddress *)((long)&uriStr_1.field_2 + 8),peVar3);
    net::IPAddress::authority_abi_cxx11_(&local_538,(IPAddress *)((long)&uriStr_1.field_2 + 8));
    poVar2 = std::operator<<(poVar2,(string *)&local_538);
    std::operator<<(poVar2,"/?service=a&service=b");
    std::__cxx11::string::~string((string *)&local_538);
    std::__cxx11::ostringstream::str();
    jaegertracing::net::URI::parse(local_668);
    jaegertracing::net::http::get((URI *)&gtest_ar_1.message_);
    psVar4 = net::http::Response::body_abi_cxx11_((Response *)&gtest_ar_1.message_);
    testing::internal::EqHelper<false>::Compare<char[41],std::__cxx11::string>
              ((EqHelper<false> *)local_6f8,"\"\'service\' parameter must occur only once\"",
               "response.body()",(char (*) [41])"\'service\' parameter must occur only once",psVar4)
    ;
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_6f8);
    if (!bVar1) {
      testing::Message::Message(local_700);
      pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_6f8);
      testing::internal::AssertHelper::AssertHelper
                (local_708,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/testutils/MockAgentTest.cpp"
                 ,0x5c,pcVar5);
      testing::internal::AssertHelper::operator=(local_708,local_700);
      testing::internal::AssertHelper::~AssertHelper(local_708);
      testing::Message::~Message(local_700);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_6f8);
    net::http::Response::~Response((Response *)&gtest_ar_1.message_);
    net::URI::~URI((URI *)local_668);
    std::__cxx11::string::~string(local_5e0);
    std::__cxx11::ostringstream::~ostringstream(local_518);
    if (bVar1) {
      std::__cxx11::ostringstream::ostringstream(local_880);
      poVar2 = std::operator<<((ostream *)local_880,"http://");
      peVar3 = std::
               __shared_ptr_access<jaegertracing::testutils::MockAgent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<jaegertracing::testutils::MockAgent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_20);
      MockAgent::samplingServerAddress((IPAddress *)((long)&uriStr_2.field_2 + 8),peVar3);
      net::IPAddress::authority_abi_cxx11_(&local_8a0,(IPAddress *)((long)&uriStr_2.field_2 + 8));
      poVar2 = std::operator<<(poVar2,(string *)&local_8a0);
      std::operator<<(poVar2,"/?service=something");
      std::__cxx11::string::~string((string *)&local_8a0);
      std::__cxx11::ostringstream::str();
      jaegertracing::net::URI::parse(local_9d0);
      jaegertracing::net::http::get(local_a50);
      sampling_manager::thrift::SamplingStrategyResponse::SamplingStrategyResponse(local_ac8);
      psVar4 = net::http::Response::body_abi_cxx11_((Response *)local_a50);
      nlohmann::detail::input_adapter::
      input_adapter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                (&local_b60,psVar4);
      std::
      function<bool_(int,_nlohmann::detail::parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>::parse_event_t,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_&)>
      ::function((function<bool_(int,_nlohmann::detail::parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>::parse_event_t,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_&)>
                  *)&gtest_ar_2.message_,(nullptr_t)0x0);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::parse(&local_b50,&local_b60,(parser_callback_t *)&gtest_ar_2.message_,true);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::
      operator_SamplingStrategyResponse<jaegertracing::sampling_manager::thrift::SamplingStrategyResponse,_0>
                (local_b40);
      jaegertracing::sampling_manager::thrift::SamplingStrategyResponse::operator=
                (local_ac8,(SamplingStrategyResponse *)local_b40);
      jaegertracing::sampling_manager::thrift::SamplingStrategyResponse::~SamplingStrategyResponse
                ((SamplingStrategyResponse *)local_b40);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::~basic_json(&local_b50);
      std::
      function<bool_(int,_nlohmann::detail::parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>::parse_event_t,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_&)>
      ::~function((function<bool_(int,_nlohmann::detail::parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>::parse_event_t,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_&)>
                   *)&gtest_ar_2.message_);
      nlohmann::detail::input_adapter::~input_adapter(&local_b60);
      local_b94 = PROBABILISTIC;
      testing::internal::EqHelper<false>::
      Compare<jaegertracing::sampling_manager::thrift::SamplingStrategyType::type,jaegertracing::sampling_manager::thrift::SamplingStrategyType::type>
                ((EqHelper<false> *)local_b90,
                 "sampling_manager::thrift::SamplingStrategyType::PROBABILISTIC",
                 "response.strategyType",&local_b94,(type *)&response_2);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b90);
      if (!bVar1) {
        testing::Message::Message(local_ba0);
        pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_b90);
        testing::internal::AssertHelper::AssertHelper
                  (local_ba8,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/testutils/MockAgentTest.cpp"
                   ,0x68,pcVar5);
        testing::internal::AssertHelper::operator=(local_ba8,local_ba0);
        testing::internal::AssertHelper::~AssertHelper(local_ba8);
        testing::Message::~Message(local_ba0);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_b90);
      jaegertracing::sampling_manager::thrift::SamplingStrategyResponse::~SamplingStrategyResponse
                (local_ac8);
      net::http::Response::~Response((Response *)local_a50);
      net::URI::~URI((URI *)local_9d0);
      std::__cxx11::string::~string(local_948);
      std::__cxx11::ostringstream::~ostringstream(local_880);
      if (bVar1) {
        sampling_manager::thrift::SamplingStrategyResponse::SamplingStrategyResponse(local_c20);
        jaegertracing::sampling_manager::thrift::SamplingStrategyResponse::__set_strategyType
                  ((type)local_c20);
        sampling_manager::thrift::RateLimitingSamplingStrategy::RateLimitingSamplingStrategy
                  (local_c30);
        jaegertracing::sampling_manager::thrift::RateLimitingSamplingStrategy::
        __set_maxTracesPerSecond((short)local_c30);
        jaegertracing::sampling_manager::thrift::SamplingStrategyResponse::
        __set_rateLimitingSampling((RateLimitingSamplingStrategy *)local_c20);
        peVar3 = std::
                 __shared_ptr_access<jaegertracing::testutils::MockAgent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<jaegertracing::testutils::MockAgent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_20);
        MockAgent::
        addSamplingStrategy<char_const(&)[11],jaegertracing::sampling_manager::thrift::SamplingStrategyResponse&>
                  (peVar3,(char (*) [11])0x346638,local_c20);
        std::__cxx11::ostringstream::ostringstream(local_da8);
        poVar2 = std::operator<<((ostream *)local_da8,"http://");
        peVar3 = std::
                 __shared_ptr_access<jaegertracing::testutils::MockAgent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<jaegertracing::testutils::MockAgent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_20);
        MockAgent::samplingServerAddress((IPAddress *)((long)&uriStr_3.field_2 + 8),peVar3);
        net::IPAddress::authority_abi_cxx11_(&local_dc8,(IPAddress *)((long)&uriStr_3.field_2 + 8));
        poVar2 = std::operator<<(poVar2,(string *)&local_dc8);
        std::operator<<(poVar2,"/?service=service123");
        std::__cxx11::string::~string((string *)&local_dc8);
        std::__cxx11::ostringstream::str();
        jaegertracing::net::URI::parse(local_ef8);
        jaegertracing::net::http::get(local_f78);
        sampling_manager::thrift::SamplingStrategyResponse::SamplingStrategyResponse(local_ff0);
        psVar4 = net::http::Response::body_abi_cxx11_((Response *)local_f78);
        nlohmann::detail::input_adapter::
        input_adapter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                  (&local_1088,psVar4);
        std::
        function<bool_(int,_nlohmann::detail::parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>::parse_event_t,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_&)>
        ::function((function<bool_(int,_nlohmann::detail::parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>::parse_event_t,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_&)>
                    *)&gtest_ar_3.message_,(nullptr_t)0x0);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::parse(&local_1078,&local_1088,(parser_callback_t *)&gtest_ar_3.message_,true);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::
        operator_SamplingStrategyResponse<jaegertracing::sampling_manager::thrift::SamplingStrategyResponse,_0>
                  (local_1068);
        jaegertracing::sampling_manager::thrift::SamplingStrategyResponse::operator=
                  (local_ff0,(SamplingStrategyResponse *)local_1068);
        jaegertracing::sampling_manager::thrift::SamplingStrategyResponse::~SamplingStrategyResponse
                  ((SamplingStrategyResponse *)local_1068);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::~basic_json(&local_1078);
        std::
        function<bool_(int,_nlohmann::detail::parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>::parse_event_t,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_&)>
        ::~function((function<bool_(int,_nlohmann::detail::parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>::parse_event_t,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_&)>
                     *)&gtest_ar_3.message_);
        nlohmann::detail::input_adapter::~input_adapter(&local_1088);
        testing::internal::EqHelper<false>::
        Compare<jaegertracing::sampling_manager::thrift::SamplingStrategyResponse,jaegertracing::sampling_manager::thrift::SamplingStrategyResponse>
                  ((EqHelper<false> *)local_10b8,"config","response",local_c20,local_ff0);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_10b8);
        if (!bVar1) {
          testing::Message::Message(local_10c0);
          pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_10b8);
          testing::internal::AssertHelper::AssertHelper
                    (local_10c8,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/testutils/MockAgentTest.cpp"
                     ,0x7b,pcVar5);
          testing::internal::AssertHelper::operator=(local_10c8,local_10c0);
          testing::internal::AssertHelper::~AssertHelper(local_10c8);
          testing::Message::~Message(local_10c0);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_10b8);
        jaegertracing::sampling_manager::thrift::SamplingStrategyResponse::~SamplingStrategyResponse
                  (local_ff0);
        net::http::Response::~Response((Response *)local_f78);
        net::URI::~URI((URI *)local_ef8);
        std::__cxx11::string::~string(local_e70);
        std::__cxx11::ostringstream::~ostringstream(local_da8);
        jaegertracing::sampling_manager::thrift::RateLimitingSamplingStrategy::
        ~RateLimitingSamplingStrategy(local_c30);
        jaegertracing::sampling_manager::thrift::SamplingStrategyResponse::~SamplingStrategyResponse
                  (local_c20);
      }
    }
  }
  std::shared_ptr<jaegertracing::testutils::MockAgent>::~shared_ptr
            ((shared_ptr<jaegertracing::testutils::MockAgent> *)local_20);
  return;
}

Assistant:

TEST(MockAgent, testSamplingManager)
{
    auto mockAgent = MockAgent::make();
    mockAgent->start();

    {
        std::ostringstream oss;
        oss << "http://" << mockAgent->samplingServerAddress().authority()
            << '/';
        const auto uriStr = oss.str();
        const auto uri = net::URI::parse(uriStr);
        const auto response = net::http::get(uri);
        ASSERT_EQ("no 'service' parameter", response.body());
    }
    {
        std::ostringstream oss;
        oss << "http://" << mockAgent->samplingServerAddress().authority()
            << "/?service=a&service=b";
        const auto uriStr = oss.str();
        const auto uri = net::URI::parse(uriStr);
        const auto response = net::http::get(uri);
        ASSERT_EQ("'service' parameter must occur only once", response.body());
    }
    {
        std::ostringstream oss;
        oss << "http://" << mockAgent->samplingServerAddress().authority()
            << "/?service=something";
        const auto uriStr = oss.str();
        const auto uri = net::URI::parse(uriStr);
        const auto responseHTTP = net::http::get(uri);
        sampling_manager::thrift::SamplingStrategyResponse response;
        response = nlohmann::json::parse(responseHTTP.body());
        ASSERT_EQ(sampling_manager::thrift::SamplingStrategyType::PROBABILISTIC,
                  response.strategyType);
    }
    {
        sampling_manager::thrift::SamplingStrategyResponse config;
        config.__set_strategyType(
            sampling_manager::thrift::SamplingStrategyType::RATE_LIMITING);
        sampling_manager::thrift::RateLimitingSamplingStrategy rateLimiting;
        rateLimiting.__set_maxTracesPerSecond(123);
        config.__set_rateLimitingSampling(rateLimiting);
        mockAgent->addSamplingStrategy("service123", config);

        std::ostringstream oss;
        oss << "http://" << mockAgent->samplingServerAddress().authority()
            << "/?service=service123";
        const auto uriStr = oss.str();
        const auto uri = net::URI::parse(uriStr);
        const auto responseHTTP = net::http::get(uri);
        sampling_manager::thrift::SamplingStrategyResponse response;
        response = nlohmann::json::parse(responseHTTP.body());
        ASSERT_EQ(config, response);
    }
}